

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

size_t VP8EstimateTokenSize(VP8TBuffer *b,uint8_t *probas)

{
  ushort uVar1;
  long *plVar2;
  int iVar3;
  long in_RSI;
  undefined8 *in_RDI;
  int bit;
  token_t token;
  token_t *tokens;
  int n;
  int N;
  VP8Tokens *next;
  VP8Tokens *p;
  size_t size;
  int local_44;
  int local_30;
  long *local_20;
  size_t local_18;
  
  local_18 = 0;
  plVar2 = (long *)*in_RDI;
  while (local_20 = plVar2, local_20 != (long *)0x0) {
    plVar2 = (long *)*local_20;
    if (plVar2 == (long *)0x0) {
      local_44 = *(int *)(in_RDI + 3);
    }
    else {
      local_44 = 0;
    }
    local_30 = *(int *)((long)in_RDI + 0x1c);
    while (local_44 < local_30) {
      uVar1 = *(ushort *)((long)local_20 + (long)(local_30 + -1) * 2 + 8);
      if ((uVar1 & 0x4000) == 0) {
        iVar3 = VP8BitCost(uVar1 & 0x8000,*(uint8_t *)(in_RSI + (ulong)(uVar1 & 0x3fff)));
      }
      else {
        iVar3 = VP8BitCost(uVar1 & 0x8000,(uint8_t)uVar1);
      }
      local_18 = (long)iVar3 + local_18;
      local_30 = local_30 + -1;
    }
  }
  return local_18;
}

Assistant:

size_t VP8EstimateTokenSize(VP8TBuffer* const b, const uint8_t* const probas) {
  size_t size = 0;
  const VP8Tokens* p = b->pages_;
  assert(!b->error_);
  while (p != NULL) {
    const VP8Tokens* const next = p->next_;
    const int N = (next == NULL) ? b->left_ : 0;
    int n = b->page_size_;
    const token_t* const tokens = TOKEN_DATA(p);
    while (n-- > N) {
      const token_t token = tokens[n];
      const int bit = token & (1 << 15);
      if (token & FIXED_PROBA_BIT) {
        size += VP8BitCost(bit, token & 0xffu);
      } else {
        size += VP8BitCost(bit, probas[token & 0x3fffu]);
      }
    }
    p = next;
  }
  return size;
}